

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferSparseBinding.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::sparse::anon_unknown_3::BufferSparseBindingCase::createInstance
          (BufferSparseBindingCase *this,Context *context)

{
  BufferSparseBindingInstance *this_00;
  Context *context_local;
  BufferSparseBindingCase *this_local;
  
  this_00 = (BufferSparseBindingInstance *)operator_new(0x80);
  BufferSparseBindingInstance::BufferSparseBindingInstance(this_00,context,this->m_bufferSize);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* BufferSparseBindingCase::createInstance (Context& context) const
{
	return new BufferSparseBindingInstance(context, m_bufferSize);
}